

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O1

int spki_table_get_all(spki_table *spki_table,uint32_t asn,uint8_t *ski,spki_record **result,
                      uint *result_size)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  uint8_t *puVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  spki_record *psVar10;
  long lVar11;
  ulong uVar12;
  uint8_t *puVar13;
  pthread_rwlock_t *__rwlock;
  uint8_t *puVar14;
  tommy_hashlin_node *ptVar15;
  long in_FS_OFFSET;
  byte bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  
  bVar16 = 0;
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  uVar7 = asn * -0x3f >> 0x11 ^ asn * -0x3f;
  uVar7 = uVar7 * -0x1ff ^ uVar7 * -0x1ff0;
  uVar7 = uVar7 * -7 ^ uVar7 * -0x1c00;
  uVar7 = uVar7 >> 0xf ^ uVar7;
  *result = (spki_record *)0x0;
  *result_size = 0;
  __rwlock = &spki_table->lock;
  pthread_rwlock_rdlock((pthread_rwlock_t *)__rwlock);
  uVar8 = (spki_table->hashtable).low_mask & uVar7;
  if (uVar8 < (spki_table->hashtable).split) {
    uVar8 = uVar7 & (spki_table->hashtable).bucket_mask;
  }
  uVar7 = 0x1f;
  if ((uVar8 | 1) != 0) {
    for (; (uVar8 | 1) >> uVar7 == 0; uVar7 = uVar7 - 1) {
    }
  }
  ptVar15 = (spki_table->hashtable).bucket[uVar7][uVar8];
  if (ptVar15 == (tommy_hashlin_node *)0x0) {
LAB_0010c775:
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
    iVar9 = 0;
  }
  else {
    do {
      if (ptVar15 == (tommy_hashlin_node *)0x0) goto LAB_0010c775;
      puVar4 = (uint8_t *)ptVar15->data;
      if (*(uint32_t *)(puVar4 + 0x14) == asn) {
        auVar17[0] = -(*ski == *puVar4);
        auVar17[1] = -(ski[1] == puVar4[1]);
        auVar17[2] = -(ski[2] == puVar4[2]);
        auVar17[3] = -(ski[3] == puVar4[3]);
        auVar17[4] = -(ski[4] == puVar4[4]);
        auVar17[5] = -(ski[5] == puVar4[5]);
        auVar17[6] = -(ski[6] == puVar4[6]);
        auVar17[7] = -(ski[7] == puVar4[7]);
        auVar17[8] = -(ski[8] == puVar4[8]);
        auVar17[9] = -(ski[9] == puVar4[9]);
        auVar17[10] = -(ski[10] == puVar4[10]);
        auVar17[0xb] = -(ski[0xb] == puVar4[0xb]);
        auVar17[0xc] = -(ski[0xc] == puVar4[0xc]);
        auVar17[0xd] = -(ski[0xd] == puVar4[0xd]);
        auVar17[0xe] = -(ski[0xe] == puVar4[0xe]);
        auVar17[0xf] = -(ski[0xf] == puVar4[0xf]);
        uVar1 = *(undefined4 *)(puVar4 + 0x10);
        uVar2 = *(undefined4 *)(ski + 0x10);
        auVar18[0] = -((char)uVar2 == (char)uVar1);
        auVar18[1] = -((char)((uint)uVar2 >> 8) == (char)((uint)uVar1 >> 8));
        auVar18[2] = -((char)((uint)uVar2 >> 0x10) == (char)((uint)uVar1 >> 0x10));
        auVar18[3] = -((char)((uint)uVar2 >> 0x18) == (char)((uint)uVar1 >> 0x18));
        auVar18[4] = 0xff;
        auVar18[5] = 0xff;
        auVar18[6] = 0xff;
        auVar18[7] = 0xff;
        auVar18[8] = 0xff;
        auVar18[9] = 0xff;
        auVar18[10] = 0xff;
        auVar18[0xb] = 0xff;
        auVar18[0xc] = 0xff;
        auVar18[0xd] = 0xff;
        auVar18[0xe] = 0xff;
        auVar18[0xf] = 0xff;
        auVar18 = auVar18 & auVar17;
        if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0010c74f;
        uVar7 = *result_size;
        *result_size = uVar7 + 1;
        psVar10 = (spki_record *)lrtr_realloc(*result,(ulong)(uVar7 + 1) << 7);
        if (psVar10 != (spki_record *)0x0) {
          *result = psVar10;
          uVar12 = (ulong)*result_size;
          psVar10[uVar12 - 1].asn = *(uint32_t *)(puVar4 + 0x14);
          psVar10[uVar12 - 1].socket = *(rtr_socket **)(puVar4 + 0x78);
          *(undefined4 *)(psVar10[uVar12 - 1].ski + 0x10) = *(undefined4 *)(puVar4 + 0x10);
          uVar5 = *(undefined8 *)(puVar4 + 8);
          *(undefined8 *)psVar10[uVar12 - 1].ski = *(undefined8 *)puVar4;
          *(undefined8 *)(psVar10[uVar12 - 1].ski + 8) = uVar5;
          puVar13 = puVar4 + 0x18;
          puVar14 = psVar10[uVar12 - 1].spki;
          for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
            *(undefined8 *)puVar14 = *(undefined8 *)puVar13;
            puVar13 = puVar13 + (ulong)bVar16 * -0x10 + 8;
            puVar14 = puVar14 + (ulong)bVar16 * -0x10 + 8;
          }
          *(undefined2 *)(psVar10[uVar12 - 1].spki + 0x58) = *(undefined2 *)(puVar4 + 0x70);
          psVar10[uVar12 - 1].spki[0x5a] = puVar4[0x72];
          goto LAB_0010c74f;
        }
        lrtr_free(*result);
        pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
        bVar6 = false;
      }
      else {
LAB_0010c74f:
        ptVar15 = ptVar15->next;
        bVar6 = true;
      }
    } while (bVar6);
    iVar9 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return iVar9;
  }
  __stack_chk_fail();
}

Assistant:

int spki_table_get_all(struct spki_table *spki_table, uint32_t asn, uint8_t *ski, struct spki_record **result,
		       unsigned int *result_size)
{
	uint32_t hash = tommy_inthash_u32(asn);
	tommy_node *result_bucket;
	void *tmp;

	*result = NULL;
	*result_size = 0;

	pthread_rwlock_rdlock(&spki_table->lock);

	/**
	 * A tommy node contains its storing key_entry (->data) as well as
	 * next and prev pointer to accommodate multiple results.
	 * The bucket is guaranteed to contain ALL the elements
	 * with the specified hash, but it can contain also others.
	 */
	result_bucket = tommy_hashlin_bucket(&spki_table->hashtable, hash);

	if (!result_bucket) {
		pthread_rwlock_unlock(&spki_table->lock);
		return SPKI_SUCCESS;
	}

	/* Build the result array */
	while (result_bucket) {
		struct key_entry *element;

		element = result_bucket->data;
		if (element->asn == asn && memcmp(element->ski, ski, sizeof(element->ski)) == 0) {
			(*result_size)++;
			tmp = lrtr_realloc(*result, *result_size * sizeof(**result));
			if (!tmp) {
				lrtr_free(*result);
				pthread_rwlock_unlock(&spki_table->lock);
				return SPKI_ERROR;
			}
			*result = tmp;
			key_entry_to_spki_record(element, *result + *result_size - 1);
		}
		result_bucket = result_bucket->next;
	}

	pthread_rwlock_unlock(&spki_table->lock);
	return SPKI_SUCCESS;
}